

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

string * __thiscall
XmlRpc::XmlRpcValue::binaryToXml_abi_cxx11_(string *__return_storage_ptr__,XmlRpcValue *this)

{
  size_type sVar1;
  char *code_in;
  int iVar2;
  Encoder encoder;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"<value>",(allocator<char> *)&encoder);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar1 = __return_storage_ptr__->_M_string_length;
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  base64::Encoder::Encoder(&encoder,0x200);
  code_in = *(char **)(this->_value).asTime;
  iVar2 = base64::Encoder::encode
                    (&encoder,code_in,((this->_value).asTime)->tm_hour - (int)code_in,
                     (__return_storage_ptr__->_M_dataplus)._M_p + sVar1);
  base64::Encoder::encode_end
            (&encoder,(__return_storage_ptr__->_M_dataplus)._M_p + sVar1 + (long)iVar2);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlRpcValue::binaryToXml() const
  {
    // Wrap with xml
    std::string xml = VALUE_TAG;
    xml += BASE64_TAG;

    std::size_t offset = xml.size();
    // might reserve too much, we'll shrink later
    xml.resize(xml.size() + base64EncodedSize(_value.asBinary->size()));

    base64::Encoder encoder;
    offset += encoder.encode(_value.asBinary->data(), _value.asBinary->size(), &xml[offset]);
    offset += encoder.encode_end(&xml[offset]);
    xml.resize(offset);

    xml += BASE64_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }